

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void post_increment_suite::test_null(void)

{
  index_type *piVar1;
  bool bVar2;
  const_iterator local_170;
  const_iterator local_158;
  undefined1 local_140 [8];
  const_iterator result_1;
  undefined1 local_110 [8];
  const_iterator where_1;
  variable data_1;
  iterator local_c0;
  iterator local_a8;
  undefined1 local_90 [8];
  iterator result;
  undefined1 local_50 [8];
  iterator where;
  variable data;
  
  piVar1 = &where.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)local_50,(basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &result.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_50,
                     (iterator *)
                     &result.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x363,"void post_increment_suite::test_null()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &result.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator++((iterator *)local_90,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_50,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_a8,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_90,&local_a8);
  boost::detail::test_impl
            ("result == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x365,"void post_increment_suite::test_null()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c0,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_50,&local_c0);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x366,"void post_increment_suite::test_null()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  piVar1 = &where_1.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((const_iterator *)local_110,(basic_variable<std::allocator<char>_> *)piVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)
             &result_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,
             (basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_110,
                     (const_iterator *)
                     &result_1.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x36b,"void post_increment_suite::test_null()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)
             &result_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator++((const_iterator *)local_140,
               (iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_110,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_158,
             (basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_140,&local_158);
  boost::detail::test_impl
            ("result == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x36d,"void post_increment_suite::test_null()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_158)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_170,
             (basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_110,&local_170);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x36e,"void post_increment_suite::test_null()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_170)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_140);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_110);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void test_null()
{
    {
        variable data;
        variable::iterator where = data.begin();
        TRIAL_PROTOCOL_TEST(where == data.end());
        variable::iterator result = where++;
        TRIAL_PROTOCOL_TEST(result == data.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        const variable data;
        variable::const_iterator where = data.begin();
        TRIAL_PROTOCOL_TEST(where == data.end());
        variable::const_iterator result = where++;
        TRIAL_PROTOCOL_TEST(result == data.end());
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
}